

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

int __thiscall
cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>::kill
          (holder<cs::tree_type<cs::token_base_*>_> *this,__pid_t __pid,int __sig)

{
  cs::
  allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>,_64UL,_cs_impl::default_allocator_provider>
  ::free((allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>,_64UL,_cs_impl::default_allocator_provider>
          *)holder<cs::tree_type<cs::token_base*>>::allocator,this);
  return (int)this;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}